

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

char * ToStringHelper(uint *a,uint count,char *dst_str,char *dst_str_end)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  if (dst_str < dst_str_end && dst_str != (char *)0x0) {
    *dst_str = '[';
    pcVar4 = dst_str + 1;
    if (pcVar4 == dst_str_end) goto LAB_0052b17e;
    *pcVar4 = '\0';
  }
  else {
LAB_0052b17e:
    pcVar4 = (char *)0x0;
  }
  pcVar4 = ToStringHelper(count,pcVar4,dst_str_end);
  if (pcVar4 < dst_str_end && pcVar4 != (char *)0x0) {
    pcVar2 = (char *)0x0;
    lVar5 = 0;
    do {
      pcVar4[lVar5] = "]="[lVar5];
      if (lVar5 == 2) {
        pcVar2 = pcVar4 + 2;
        break;
      }
      lVar1 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (pcVar4 + lVar1 != dst_str_end);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  if (a == (uint *)0x0) {
    if (pcVar2 >= dst_str_end || pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    lVar5 = 0;
    do {
      pcVar2[lVar5] = "Stream cannot be null"[lVar5 + 0x11];
      if (lVar5 == 4) {
        return pcVar2 + 4;
      }
      lVar1 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (pcVar2 + lVar1 != dst_str_end);
    return (char *)0x0;
  }
  if (pcVar2 < dst_str_end && pcVar2 != (char *)0x0) {
    *pcVar2 = '(';
    pcVar2 = pcVar2 + 1;
    if (pcVar2 != dst_str_end) {
      *pcVar2 = '\0';
      goto LAB_0052b202;
    }
  }
  pcVar2 = (char *)0x0;
LAB_0052b202:
  if (count == 0xffffffff) {
    if (dst_str_end <= pcVar2 || pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    *pcVar2 = '?';
    pcVar2 = pcVar2 + 1;
    if (pcVar2 == dst_str_end) {
      return (char *)0x0;
    }
    *pcVar2 = '\0';
  }
  else {
    uVar3 = 4;
    if (count < 8) {
      uVar3 = (ulong)count;
    }
    if ((int)uVar3 != 0) {
      uVar6 = 0;
      do {
        if (uVar6 != 0) {
          if (pcVar2 < dst_str_end && pcVar2 != (char *)0x0) {
            *pcVar2 = ',';
            pcVar2 = pcVar2 + 1;
            if (pcVar2 != dst_str_end) {
              *pcVar2 = '\0';
              goto LAB_0052b24a;
            }
          }
          pcVar2 = (char *)0x0;
        }
LAB_0052b24a:
        pcVar2 = ToStringHelper(a[uVar6],pcVar2,dst_str_end);
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    if (7 < count) {
      pcVar4 = (char *)0x0;
      if (pcVar2 < dst_str_end && pcVar2 != (char *)0x0) {
        lVar5 = 0;
        do {
          pcVar2[lVar5] = ",...,"[lVar5];
          if (lVar5 == 5) {
            pcVar4 = pcVar2 + 5;
            break;
          }
          lVar1 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (pcVar2 + lVar1 != dst_str_end);
      }
      pcVar2 = ToStringHelper(a[count - 1],pcVar4,dst_str_end);
    }
  }
  if (pcVar2 < dst_str_end && pcVar2 != (char *)0x0) {
    *pcVar2 = ')';
    pcVar2 = pcVar2 + 1;
    if (pcVar2 != dst_str_end) {
      *pcVar2 = '\0';
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static char* ToStringHelper( const unsigned int* a, unsigned int count, char* dst_str, const char* dst_str_end )
{
  unsigned int i, imax;

  dst_str = ToStringHelper("[",dst_str,dst_str_end);
  dst_str = ToStringHelper(count,dst_str,dst_str_end);
  dst_str = ToStringHelper("]=",dst_str,dst_str_end);
  if ( 0 == a )
    dst_str = ToStringHelper("null",dst_str,dst_str_end);
  else
  {
    dst_str = ToStringHelper("(",dst_str,dst_str_end);
    if ( ON_UNSET_UINT_INDEX == count )
    {
      dst_str = ToStringHelper("?",dst_str,dst_str_end);
    }
    else
    {
      imax = (count <= 7 ? count : 4 );
      for ( i = 0; i < imax; i++ )
      {
        if ( i )
          dst_str = ToStringHelper(",",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[i],dst_str,dst_str_end);
      }
      if ( i < count )
      {
        dst_str = ToStringHelper(",...,",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[count-1],dst_str,dst_str_end);
      }
    }
    dst_str = ToStringHelper(")",dst_str,dst_str_end);
  }

  return dst_str;
}